

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_parser.c
# Opt level: O2

RK_U32 inverse_recenter(RK_S32 r,RK_U32 v)

{
  if ((int)v <= r * 2) {
    if ((v & 1) != 0) {
      return r - (v + 1 >> 1);
    }
    v = (v >> 1) + r;
  }
  return v;
}

Assistant:

static RK_U32 inverse_recenter(RK_S32 r, RK_U32 v)
{
    if ((RK_S32)v > 2 * r)
        return v;
    else if (v & 1)
        return r - ((v + 1) >> 1);
    else
        return r + (v >> 1);
}